

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O3

bool __thiscall
QMetaMethod::invoke(QMetaMethod *this,Data object,uint connectionType,undefined8 param_4,
                   void *param_5,undefined8 param_6,undefined8 param_7,undefined8 param_8,
                   undefined8 param_9,undefined8 param_10,undefined8 param_11,undefined8 param_12,
                   undefined8 param_13,undefined8 param_14,undefined8 param_15,undefined8 param_16,
                   undefined8 param_17,undefined8 param_18,undefined8 param_19,undefined8 param_20,
                   undefined8 param_21,undefined8 param_22,undefined8 param_23,undefined8 param_24,
                   undefined8 param_25,undefined8 param_26)

{
  bool bVar1;
  long lVar2;
  long in_FS_OFFSET;
  QMetaMethod self;
  QMetaTypeInterface **in_stack_fffffffffffffef8;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  void *local_98 [12];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((QMetaMethod *)this->mobj == (QMetaMethod *)0x0 || object.d == (uint *)0x0) {
    bVar1 = false;
  }
  else {
    local_98[1] = (void *)param_8;
    local_98[2] = (void *)param_10;
    local_98[3] = (void *)param_12;
    local_98[4] = (void *)param_14;
    local_98[5] = (void *)param_16;
    local_98[6] = (void *)param_18;
    local_98[7] = (void *)param_20;
    local_98[8] = (void *)param_22;
    local_98[9] = (void *)param_24;
    local_98[10] = (void *)param_26;
    local_f0 = param_7;
    local_e8 = param_9;
    local_e0 = param_11;
    local_d8 = param_13;
    local_d0 = param_15;
    local_c8 = param_17;
    local_c0 = param_19;
    local_b8 = param_21;
    local_b0 = param_23;
    local_a8 = param_25;
    lVar2 = 1;
    do {
      if (((char *)local_98[lVar2] == (char *)0x0) || (*local_98[lVar2] == '\0')) goto LAB_002824b8;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0xb);
    lVar2 = 0xb;
LAB_002824b8:
    self.data.d = object.d;
    self.mobj = (QMetaObject *)(this->data).d;
    local_f8 = param_4;
    local_98[0] = param_5;
    bVar1 = invokeImpl((QMetaMethod *)this->mobj,self,(void *)(ulong)connectionType,
                       (ConnectionType)lVar2,(qsizetype)&local_f8,local_98,(char **)0x0,
                       in_stack_fffffffffffffef8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QMetaMethod::invoke(QObject *object,
                         Qt::ConnectionType connectionType,
                         QGenericReturnArgument returnValue,
                         QGenericArgument val0,
                         QGenericArgument val1,
                         QGenericArgument val2,
                         QGenericArgument val3,
                         QGenericArgument val4,
                         QGenericArgument val5,
                         QGenericArgument val6,
                         QGenericArgument val7,
                         QGenericArgument val8,
                         QGenericArgument val9) const
{
    if (!object || !mobj)
        return false;

    // check argument count (we don't allow invoking a method if given too few arguments)
    const char *typeNames[] = {
        returnValue.name(),
        val0.name(),
        val1.name(),
        val2.name(),
        val3.name(),
        val4.name(),
        val5.name(),
        val6.name(),
        val7.name(),
        val8.name(),
        val9.name()
    };
    void *param[] = {
        returnValue.data(),
        val0.data(),
        val1.data(),
        val2.data(),
        val3.data(),
        val4.data(),
        val5.data(),
        val6.data(),
        val7.data(),
        val8.data(),
        val9.data()
    };

    int paramCount;
    for (paramCount = 1; paramCount < MaximumParamCount; ++paramCount) {
        if (qstrlen(typeNames[paramCount]) <= 0)
            break;
    }
    return invokeImpl(*this, object, connectionType, paramCount, param, typeNames, nullptr);
}